

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::SystemTimingCheckSyntax::setChild
          (SystemTimingCheckSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined8 in_RDX;
  
  (*(code *)(&DAT_0041b5f0 + *(int *)(&DAT_0041b5f0 + index * 4)))
            (&child,index,in_RDX,&DAT_0041b5f0 + *(int *)(&DAT_0041b5f0 + index * 4));
  return;
}

Assistant:

void SystemTimingCheckSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: name = child.token(); return;
        case 2: openParen = child.token(); return;
        case 3: args = child.node()->as<SeparatedSyntaxList<TimingCheckArgSyntax>>(); return;
        case 4: closeParen = child.token(); return;
        case 5: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}